

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::drawPoints
          (TransformFeedbackOverflowQueryFunctionalBase *this,GLsizei count)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLsizei count_local;
  TransformFeedbackOverflowQueryFunctionalBase *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)
  ;
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  beginQueries(this);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x538))(0,0,count);
  endQueries(this);
  return;
}

Assistant:

void drawPoints(GLsizei count)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		beginQueries();
		gl.drawArrays(GL_POINTS, 0, count);
		endQueries();
	}